

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineRenderToImageTests.cpp
# Opt level: O3

TestStatus *
vkt::pipeline::anon_unknown_0::testAttachmentSize
          (TestStatus *__return_storage_ptr__,Context *context,CaseDef_conflict *caseDef)

{
  int *piVar1;
  deUint32 *pdVar2;
  deUint32 dVar3;
  VkFormat VVar4;
  TestLog *log;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  undefined1 auVar5 [16];
  Allocator *pAVar6;
  Vector<int,_4> VVar7;
  undefined8 uVar8;
  int aiVar9 [4];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  string *psVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  Handle<(vk::HandleType)8> obj;
  bool bVar17;
  int iVar18;
  ChannelOrder CVar19;
  VkResult result;
  DeviceInterface *vk;
  VkDevice device;
  VkPhysicalDevice pVVar20;
  VkPhysicalDeviceProperties *pVVar21;
  long lVar22;
  TextureFormat TVar23;
  long lVar24;
  const_iterator cVar25;
  deUint64 *pdVar26;
  undefined8 *puVar27;
  OutOfMemoryError *this;
  NotSupportedError *this_00;
  long lVar28;
  undefined8 uVar29;
  int iVar30;
  ulong uVar31;
  long lVar32;
  int iVar33;
  ulong uVar34;
  ulong uVar35;
  uint uVar36;
  VkImageViewType VVar37;
  deUint32 dVar38;
  deUint32 dVar39;
  long lVar40;
  long lVar41;
  VkDeviceSize VVar42;
  uint uVar43;
  long lVar44;
  VkPipeline basePipeline;
  undefined1 auVar45 [16];
  int iVar46;
  VkFormatProperties VVar47;
  long *local_a20;
  Vector<int,_4> local_9f8;
  Allocator *local_9e0;
  int local_9d4;
  InstanceInterface *local_9d0;
  undefined1 local_9c8 [12];
  int iStack_9bc;
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  attachmentHandles;
  undefined1 local_988 [16];
  VkMemoryType local_978;
  VkFormat VStack_970;
  deUint32 dStack_96c;
  deUint32 dStack_968;
  deUint32 local_964;
  deUint32 local_960;
  deUint32 local_95c;
  undefined8 local_958;
  undefined8 uStack_950;
  deUint32 local_948;
  deUint32 *local_940;
  VkImageLayout local_938;
  VkFormat local_928;
  int iStack_924;
  int iStack_920;
  int iStack_91c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_918;
  string *local_910;
  int local_904;
  int local_900;
  deUint32 local_8fc;
  VkImage local_8f8;
  Deleter<vk::Handle<(vk::HandleType)9>_> DStack_8f0;
  VkFramebuffer local_8d8;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_8d0;
  VkBuffer local_8b8;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_8b0;
  VkImage local_898;
  Deleter<vk::Handle<(vk::HandleType)9>_> DStack_890;
  int local_878;
  int iStack_874;
  int iStack_870;
  int iStack_86c;
  deUint32 local_868;
  int iStack_864;
  int iStack_860;
  int iStack_85c;
  long local_850;
  undefined1 local_848 [8];
  undefined1 auStack_840 [8];
  undefined1 local_838 [16];
  undefined1 local_828 [8];
  undefined1 auStack_820 [8];
  undefined1 local_818 [16];
  undefined1 local_808 [8];
  undefined1 auStack_800 [8];
  undefined1 local_7f8 [16];
  VkRenderPass local_7e8;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_7e0;
  VkImageSubresourceRange res_1;
  VkImageSubresourceRange res;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  pipelines;
  VkPhysicalDeviceMemoryProperties memoryProperties;
  Move<vk::Handle<(vk::HandleType)8>_> local_568;
  undefined1 local_548 [16];
  undefined1 local_538 [16];
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  depthStencilAttachments;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  colorAttachments;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_4e0;
  VkQueue local_4c0;
  VkPipelineLayout local_4b8;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_4b0;
  deUint64 local_498;
  DeviceInterface *pDStack_490;
  VkDevice local_488;
  VkAllocationCallbacks *pVStack_480;
  deUint64 local_478;
  DeviceInterface *pDStack_470;
  VkDevice local_468;
  VkAllocationCallbacks *pVStack_460;
  deUint64 local_458;
  DeviceInterface *pDStack_450;
  VkDevice local_448;
  VkAllocationCallbacks *pVStack_440;
  deUint64 local_438;
  DeviceInterface *pDStack_430;
  VkDevice local_428;
  VkAllocationCallbacks *pVStack_420;
  VkBufferCreateInfo bufferCreateInfo_1;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> vertices;
  ios_base local_360 [264];
  VkBufferCreateInfo bufferCreateInfo;
  VkImageCreateInfo local_220;
  int local_1c8;
  int iStack_1c4;
  int iStack_1c0;
  int iStack_1bc;
  VkDeviceSize vertexBufferOffset;
  int local_1b0 [6];
  void *local_198;
  undefined8 local_190;
  undefined8 local_188;
  
  checkImageViewTypeRequirements(context,caseDef->viewType);
  local_910 = (string *)&__return_storage_ptr__->m_description;
  local_918 = &(__return_storage_ptr__->m_description).field_2;
  local_9d4 = 0;
  vk = Context::getDeviceInterface(context);
  local_9d0 = Context::getInstanceInterface(context);
  device = Context::getDevice(context);
  pVVar20 = Context::getPhysicalDevice(context);
  local_878 = (int)pVVar20;
  iStack_874 = (int)((ulong)pVVar20 >> 0x20);
  local_4c0 = Context::getUniversalQueue(context);
  local_8fc = Context::getUniversalQueueFamilyIndex(context);
  local_9e0 = Context::getDefaultAllocator(context);
  local_928 = caseDef->depthStencilFormat;
  ::vk::getPhysicalDeviceMemoryProperties
            (&memoryProperties,local_9d0,(VkPhysicalDevice)CONCAT44(iStack_874,local_878));
  if ((ulong)memoryProperties.memoryHeapCount == 0) {
    uVar34 = 0;
  }
  else {
    lVar28 = 0;
    uVar34 = 0;
    do {
      if (((*(byte *)((long)&memoryProperties.memoryHeaps[0].flags + lVar28) & 1) != 0) &&
         (uVar31 = *(ulong *)((long)&memoryProperties.memoryHeaps[0].size + lVar28),
         uVar34 <= uVar31)) {
        uVar34 = uVar31;
      }
      lVar28 = lVar28 + 0x10;
    } while ((ulong)memoryProperties.memoryHeapCount << 4 != lVar28);
    uVar34 = uVar34 >> 2;
  }
  pVVar21 = Context::getDeviceProperties(context);
  if (local_928 == VK_FORMAT_UNDEFINED) {
    dVar38 = (pVVar21->limits).maxImageDimension3D;
    local_9f8.m_data[3] = (pVVar21->limits).maxImageArrayLayers;
    local_9f8.m_data[2] = dVar38;
  }
  else {
    dVar38 = (pVVar21->limits).maxImageDimension3D;
    local_9f8.m_data[3] = (pVVar21->limits).maxImageArrayLayers;
    local_9f8.m_data[2] = dVar38;
    if (local_9f8.m_data[3] < (int)dVar38) {
      local_9f8.m_data[2] = local_9f8.m_data[3];
    }
  }
  dVar39 = (caseDef->imageSizeHint).m_data[0];
  if (dVar39 == 0xffffffff) {
    dVar39 = (pVVar21->limits).maxFramebufferWidth;
  }
  local_9f8.m_data[1] = (caseDef->imageSizeHint).m_data[1];
  if (local_9f8.m_data[1] == 0xffffffff) {
    local_9f8.m_data[1] = (pVVar21->limits).maxFramebufferHeight;
  }
  VVar37 = caseDef->viewType;
  dVar3 = (caseDef->imageSizeHint).m_data[2];
  if (dVar3 != 0xffffffff) {
    local_9f8.m_data[2] = dVar3;
  }
  dVar3 = (caseDef->imageSizeHint).m_data[3];
  if (dVar3 != 0xffffffff) {
    local_9f8.m_data[3] = dVar3;
  }
  switch(VVar37) {
  case VK_IMAGE_VIEW_TYPE_1D:
  case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
    local_9f8.m_data[0] = (pVVar21->limits).maxImageDimension1D;
    if ((int)dVar39 < local_9f8.m_data[0]) {
      local_9f8.m_data[0] = dVar39;
    }
    break;
  case VK_IMAGE_VIEW_TYPE_2D:
  case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
    dVar38 = (pVVar21->limits).maxImageDimension2D;
    if ((int)dVar38 <= (int)dVar39) {
      dVar39 = dVar38;
    }
    local_9f8.m_data[0] = dVar39;
    if ((int)dVar38 <= local_9f8.m_data[1]) {
      local_9f8.m_data[1] = dVar38;
    }
    break;
  case VK_IMAGE_VIEW_TYPE_3D:
    if ((int)dVar38 <= (int)dVar39) {
      dVar39 = dVar38;
    }
    local_9f8.m_data[0] = dVar39;
    if ((int)dVar38 <= local_9f8.m_data[1]) {
      local_9f8.m_data[1] = dVar38;
    }
    break;
  case VK_IMAGE_VIEW_TYPE_CUBE:
  case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
    local_9f8.m_data[1] = (pVVar21->limits).maxImageDimensionCube;
    if ((int)dVar39 < local_9f8.m_data[1]) {
      local_9f8.m_data[1] = dVar39;
    }
    local_9f8.m_data[3] = (local_9f8.m_data[3] / 6) * 6;
    local_9f8.m_data[0] = local_9f8.m_data[1];
    break;
  default:
    local_9f8.m_data[0] = 0;
    local_9f8.m_data[1] = 0;
    local_9f8.m_data[2] = 0;
    local_9f8.m_data[3] = 0;
    goto LAB_004f5e6f;
  }
LAB_004f5e6f:
  if (0 < local_9d4) {
    iVar18 = 0;
    do {
      uVar8 = local_9f8.m_data._8_8_;
      local_9c8._0_4_ = local_9f8.m_data[0];
      local_9c8._4_4_ = local_9f8.m_data[1];
      local_9c8._8_4_ = local_9f8.m_data[2];
      iStack_9bc = local_9f8.m_data[3];
      aiVar9 = _local_9c8;
      uVar35 = 1;
      local_9c8._0_4_ = local_9f8.m_data[0];
      uVar31 = 0;
      do {
        if ((int)local_9c8._0_4_ < *(int *)(local_9c8 + uVar35 * 4)) {
          uVar31 = uVar35 & 0xffffffff;
          local_9c8._0_4_ = *(int *)(local_9c8 + uVar35 * 4);
        }
        uVar35 = uVar35 + 1;
      } while (uVar35 != 4);
      iVar30 = (int)uVar31;
      uVar43 = *(uint *)(local_9c8 + (long)iVar30 * 4);
      uVar36 = (int)uVar43 >> 1;
      if ((VVar37 == VK_IMAGE_VIEW_TYPE_CUBE_ARRAY) || (VVar37 == VK_IMAGE_VIEW_TYPE_CUBE)) {
        if (iVar30 < 2) {
          local_9f8.m_data[2] = (int)uVar8;
          local_9f8.m_data[3] = SUB84(uVar8,4);
          local_9c8._8_4_ = local_9f8.m_data[2];
          iStack_9bc = local_9f8.m_data[3];
          local_9c8._4_4_ = uVar36;
          local_9c8._0_4_ = uVar36;
          goto LAB_004f5f05;
        }
        if ((iVar30 != 3) || ((int)uVar36 < 6)) {
          local_9c8._0_4_ = 0;
          local_9c8._4_4_ = 0;
          local_9c8._8_4_ = 0;
          iStack_9bc = 0;
          goto LAB_004f5f05;
        }
        local_9c8 = local_9f8.m_data._0_12_;
        iStack_9bc = (uVar36 / 6) * 6;
      }
      else {
        _local_9c8 = aiVar9;
        *(uint *)(local_9c8 + (long)iVar30 * 4) = uVar36;
LAB_004f5f05:
        if (uVar43 < 2) {
          local_9c8._0_4_ = 0;
          local_9c8._4_4_ = 0;
          local_9c8._8_4_ = 0;
          iStack_9bc = 0;
        }
      }
      local_9f8.m_data[0] = local_9c8._0_4_;
      local_9f8.m_data[1] = local_9c8._4_4_;
      local_9f8.m_data[2] = local_9c8._8_4_;
      local_9f8.m_data[3] = iStack_9bc;
      VVar7.m_data = local_9f8.m_data;
      memoryProperties.memoryTypeCount = 0;
      memoryProperties.memoryTypes[0].propertyFlags = 0;
      memoryProperties.memoryTypes[0].heapIndex = 0;
      memoryProperties.memoryTypes[1].propertyFlags = 0;
      local_9f8.m_data[0] = local_9c8._0_4_;
      local_9f8 = VVar7;
      if (local_9f8.m_data[0] == 0) {
        uVar31 = 0xffffffffffffffff;
        do {
          if (uVar31 == 2) goto LAB_004f60d9;
          lVar28 = uVar31 + 2;
          uVar35 = uVar31 + 1;
          pdVar2 = &memoryProperties.memoryTypes[0].heapIndex + uVar31;
          uVar31 = uVar35;
        } while (local_9f8.m_data[lVar28] == *pdVar2);
        if (2 < uVar35) {
LAB_004f60d9:
          pdVar2 = &memoryProperties.memoryTypes[1].heapIndex;
          memoryProperties.memoryTypes[0].heapIndex = 0;
          memoryProperties.memoryTypes[1].propertyFlags = 0;
          local_850 = 0x2b;
          memoryProperties._0_8_ = pdVar2;
          memoryProperties._0_8_ =
               std::__cxx11::string::_M_create((ulong *)&memoryProperties,(ulong)&local_850);
          memoryProperties.memoryTypes[1].heapIndex = (undefined4)local_850;
          memoryProperties.memoryTypes[2].propertyFlags = local_850._4_4_;
          builtin_strncpy((char *)memoryProperties._0_8_,
                          "Couldn\'t create an image with required size",0x2b);
          memoryProperties.memoryTypes[0].heapIndex = (undefined4)local_850;
          memoryProperties.memoryTypes[1].propertyFlags = local_850._4_4_;
          *(char *)(memoryProperties._0_8_ + local_850) = '\0';
          __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)local_918;
          std::__cxx11::string::_M_construct<char*>
                    (local_910,memoryProperties._0_8_,(char *)(memoryProperties._0_8_ + local_850));
          if ((deUint32 *)memoryProperties._0_8_ == pdVar2) {
            return __return_storage_ptr__;
          }
          operator_delete((void *)memoryProperties._0_8_,memoryProperties.memoryTypes._12_8_ + 1);
          return __return_storage_ptr__;
        }
      }
      iVar18 = iVar18 + 1;
    } while (iVar18 != local_9d4);
  }
  vertices.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)context->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream
            ((ostringstream *)
             &vertices.
              super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             &vertices.
              super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
              ._M_impl.super__Vector_impl_data._M_finish,
             "Using an image with size (width, height, depth, layers) = ",0x3a);
  tcu::operator<<((ostream *)
                  &vertices.
                   super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_9f8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&vertices,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)
             &vertices.
              super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  std::ios_base::~ios_base(local_360);
  lVar28 = (long)local_9f8.m_data[2];
  lVar32 = (long)local_9f8.m_data[3];
  local_868 = local_9f8.m_data[3];
  if (local_9f8.m_data[3] < local_9f8.m_data[2]) {
    local_868 = local_9f8.m_data[2];
  }
  lVar40 = (long)local_9f8.m_data[0];
  lVar22 = (long)local_9f8.m_data[1];
  TVar23 = ::vk::mapVkFormat(caseDef->colorFormat);
  iVar18 = tcu::getPixelSize(TVar23);
  if (local_928 == VK_FORMAT_UNDEFINED) {
    lVar24 = 0;
  }
  else {
    lVar24 = (long)local_9f8.m_data[0];
    lVar41 = (long)local_9f8.m_data[1];
    lVar44 = (long)local_9f8.m_data[2];
    local_538._0_8_ = (long)local_9f8.m_data[3];
    TVar23 = ::vk::mapVkFormat(caseDef->depthStencilFormat);
    local_548._0_4_ = tcu::getPixelSize(TVar23);
    VVar47 = ::vk::getPhysicalDeviceFormatProperties
                       (local_9d0,(VkPhysicalDevice)CONCAT44(iStack_874,local_878),
                        caseDef->depthStencilFormat);
    if ((VVar47._0_8_ >> 0x29 & 1) == 0) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Unsupported depth/stencil format",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineRenderToImageTests.cpp"
                 ,0x340);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    lVar24 = (long)(int)local_548._0_4_ * lVar44 * local_538._0_8_ * lVar41 * lVar24;
  }
  if ((ulong)(lVar40 * lVar22 * lVar32 * lVar28 * (long)iVar18 + lVar24) <= uVar34) {
    local_878 = local_9f8.m_data[0];
    iStack_874 = local_9f8.m_data[1];
    iStack_870 = local_9f8.m_data[2];
    iStack_86c = local_9f8.m_data[3];
    TVar23 = ::vk::mapVkFormat(caseDef->colorFormat);
    iVar18 = tcu::getPixelSize(TVar23);
    auVar5._4_4_ = iStack_874;
    auVar5._0_4_ = local_878;
    auVar5._8_4_ = iStack_870;
    auVar5._12_4_ = iStack_86c;
    auVar45._0_4_ = -(uint)(local_878 < (int)DAT_00ae9720);
    auVar45._4_4_ = -(uint)(iStack_874 < DAT_00ae9720._4_4_);
    auVar45._8_4_ = -(uint)(iStack_870 < DAT_00ae9720._8_4_);
    auVar45._12_4_ = -(uint)(iStack_86c < DAT_00ae9720._12_4_);
    local_548 = ~auVar45 & _DAT_00ae9720 | auVar5 & auVar45;
    uVar43 = local_548._0_4_;
    iVar30 = local_548._4_4_;
    iVar33 = local_548._8_4_;
    iVar46 = local_548._12_4_;
    local_538._0_8_ = local_548._8_8_;
    local_538._8_4_ = iVar33;
    local_538._12_4_ = iVar46;
    VVar42 = (long)iVar18 * (long)iVar46 * (long)iVar33 * (long)iVar30 * (long)(int)uVar43;
    local_1c8 = iVar46;
    iStack_1c4 = iVar46;
    iStack_1c0 = iVar46;
    iStack_1bc = iVar46;
    makeBufferCreateInfo(&bufferCreateInfo,VVar42,2);
    ::vk::createBuffer(&local_568,vk,device,&bufferCreateInfo,(VkAllocationCallbacks *)0x0);
    obj.m_internal =
         local_568.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
    pAVar6 = local_9e0;
    DStack_4e0.m_deviceIface =
         local_568.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
    DStack_4e0.m_device =
         local_568.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
    DStack_4e0.m_allocator =
         local_568.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
    local_9d0 = (InstanceInterface *)(ulong)uVar43;
    local_904 = iVar33;
    local_900 = iVar46;
    bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&memoryProperties,vk,
               device,local_9e0,
               (VkBuffer)
               local_568.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
               (MemoryRequirement)0x1);
    uVar8 = memoryProperties._0_8_;
    memset(*(void **)(memoryProperties._0_8_ + 0x18),0,VVar42);
    ::vk::flushMappedMemoryRange
              (vk,device,(VkDeviceMemory)*(deUint64 *)(uVar8 + 8),*(VkDeviceSize *)(uVar8 + 0x10),
               0xffffffffffffffff);
    dVar38 = local_868;
    vertices.
    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)&vertices.
                   super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    vertices.
    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x4;
    vertices.
    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT35(vertices.
                           super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_,0x74726576);
    cVar25 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                     *)context->m_progCollection,(key_type *)&vertices);
    ::vk::createShaderModule
              ((Move<vk::Handle<(vk::HandleType)14>_> *)&memoryProperties,vk,device,
               *(ProgramBinary **)(cVar25._M_node + 2),0);
    bufferCreateInfo.flags = memoryProperties.memoryTypes[1].heapIndex;
    bufferCreateInfo._20_4_ = memoryProperties.memoryTypes[2].propertyFlags;
    bufferCreateInfo.size._0_4_ = memoryProperties.memoryTypes[2].heapIndex;
    bufferCreateInfo.size._4_4_ = memoryProperties.memoryTypes[3].propertyFlags;
    bufferCreateInfo.sType = memoryProperties.memoryTypeCount;
    bufferCreateInfo._4_4_ = memoryProperties.memoryTypes[0].propertyFlags;
    bufferCreateInfo.pNext = (void *)memoryProperties.memoryTypes._4_8_;
    memoryProperties.memoryTypeCount = 0;
    memoryProperties.memoryTypes[0].propertyFlags = 0;
    memoryProperties.memoryTypes[0].heapIndex = 0;
    memoryProperties.memoryTypes[1].propertyFlags = 0;
    memoryProperties.memoryTypes[1].heapIndex = 0;
    memoryProperties.memoryTypes[2].propertyFlags = 0;
    memoryProperties.memoryTypes[2].heapIndex = 0;
    memoryProperties.memoryTypes[3].propertyFlags = 0;
    if (vertices.
        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pointer)&vertices.
                  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(vertices.
                      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)((vertices.
                                      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->position)
                                    .m_data + 1));
    }
    vertices.
    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x4;
    vertices.
    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)&vertices.
                   super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    vertices.
    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT35(vertices.
                           super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_,0x67617266);
    cVar25 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                     *)context->m_progCollection,(key_type *)&vertices);
    ::vk::createShaderModule
              ((Move<vk::Handle<(vk::HandleType)14>_> *)&memoryProperties,vk,device,
               *(ProgramBinary **)(cVar25._M_node + 2),0);
    local_568.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
         (VkDevice)memoryProperties.memoryTypes._12_8_;
    local_568.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)memoryProperties.memoryTypes._20_8_;
    local_568.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal._0_4_ =
         memoryProperties.memoryTypeCount;
    local_568.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal._4_4_ =
         memoryProperties.memoryTypes[0].propertyFlags;
    local_568.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)memoryProperties.memoryTypes._4_8_;
    memoryProperties.memoryTypeCount = 0;
    memoryProperties.memoryTypes[0].propertyFlags = 0;
    memoryProperties.memoryTypes[0].heapIndex = 0;
    memoryProperties.memoryTypes[1].propertyFlags = 0;
    memoryProperties.memoryTypes[1].heapIndex = 0;
    memoryProperties.memoryTypes[2].propertyFlags = 0;
    memoryProperties.memoryTypes[2].heapIndex = 0;
    memoryProperties.memoryTypes[3].propertyFlags = 0;
    if (vertices.
        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pointer)&vertices.
                  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(vertices.
                      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)((vertices.
                                      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->position)
                                    .m_data + 1));
    }
    makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)&memoryProperties,vk,device,
                   caseDef->colorFormat,caseDef->depthStencilFormat,dVar38,VK_IMAGE_LAYOUT_UNDEFINED
                   ,VK_IMAGE_LAYOUT_UNDEFINED);
    auVar5 = (undefined1  [16])memoryProperties._0_16_;
    DStack_7e0.m_device = (VkDevice)memoryProperties.memoryTypes._12_8_;
    DStack_7e0.m_allocator = (VkAllocationCallbacks *)memoryProperties.memoryTypes._20_8_;
    local_7e8.m_internal._0_4_ = memoryProperties.memoryTypeCount;
    local_7e8.m_internal._4_4_ = memoryProperties.memoryTypes[0].propertyFlags;
    DStack_7e0.m_deviceIface = (DeviceInterface *)memoryProperties.memoryTypes._4_8_;
    memoryProperties._0_16_ = auVar5;
    makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&memoryProperties,vk,device);
    auVar5 = (undefined1  [16])memoryProperties._0_16_;
    DStack_4b0.m_device = (VkDevice)memoryProperties.memoryTypes._12_8_;
    DStack_4b0.m_allocator = (VkAllocationCallbacks *)memoryProperties.memoryTypes._20_8_;
    local_4b8.m_internal._0_4_ = memoryProperties.memoryTypeCount;
    local_4b8.m_internal._4_4_ = memoryProperties.memoryTypes[0].propertyFlags;
    DStack_4b0.m_deviceIface = (DeviceInterface *)memoryProperties.memoryTypes._4_8_;
    pipelines.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pipelines.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pipelines.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    DStack_8f0.m_device = (VkDevice)0x0;
    DStack_8f0.m_allocator = (VkAllocationCallbacks *)0x0;
    local_8f8.m_internal = 0;
    DStack_8f0.m_deviceIface = (DeviceInterface *)0x0;
    colorAttachments.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    colorAttachments.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colorAttachments.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    DStack_890.m_device = (VkDevice)0x0;
    DStack_890.m_allocator = (VkAllocationCallbacks *)0x0;
    local_898.m_internal = 0;
    DStack_890.m_deviceIface = (DeviceInterface *)0x0;
    depthStencilAttachments.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    depthStencilAttachments.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    depthStencilAttachments.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    attachmentHandles.
    super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    attachmentHandles.
    super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    attachmentHandles.
    super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    DStack_8b0.m_device = (VkDevice)0x0;
    DStack_8b0.m_allocator = (VkAllocationCallbacks *)0x0;
    local_8b8.m_internal = 0;
    DStack_8b0.m_deviceIface = (DeviceInterface *)0x0;
    DStack_8d0.m_device = (VkDevice)0x0;
    DStack_8d0.m_allocator = (VkAllocationCallbacks *)0x0;
    local_8d8.m_internal = 0;
    DStack_8d0.m_deviceIface = (DeviceInterface *)0x0;
    uVar34 = (ulong)caseDef->viewType;
    local_978.propertyFlags = (uint)(uVar34 == 6 || uVar34 == 3) << 4;
    if (uVar34 == 2) {
      local_978.propertyFlags = 0x20;
    }
    local_978.heapIndex = VK_IMAGE_TYPE_LAST;
    if (uVar34 < 7) {
      local_978.heapIndex = *(deUint32 *)(&DAT_00ae990c + uVar34 * 4);
    }
    VStack_970 = caseDef->colorFormat;
    local_988._0_4_ = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
    local_988._8_8_ = (void *)0x0;
    dStack_96c = local_9f8.m_data[0];
    dStack_968 = local_9f8.m_data[1];
    local_964 = local_9f8.m_data[2];
    local_960 = 1;
    local_95c = local_9f8.m_data[3];
    local_958._0_4_ = VK_SAMPLE_COUNT_1_BIT;
    local_958._4_4_ = VK_IMAGE_TILING_OPTIMAL;
    uStack_950._0_4_ = 0x11;
    uStack_950._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
    local_948 = 0;
    local_940 = (deUint32 *)0x0;
    local_938 = VK_IMAGE_LAYOUT_UNDEFINED;
    memoryProperties._0_16_ = auVar5;
    ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&memoryProperties,vk,device,
                      (VkImageCreateInfo *)local_988,(VkAllocationCallbacks *)0x0);
    uVar12 = memoryProperties._0_8_;
    uVar13 = memoryProperties.memoryTypes._4_8_;
    uVar29 = memoryProperties.memoryTypes._12_8_;
    uVar14 = memoryProperties.memoryTypes._20_8_;
    local_488 = (VkDevice)memoryProperties.memoryTypes._12_8_;
    pVStack_480 = (VkAllocationCallbacks *)memoryProperties.memoryTypes._20_8_;
    local_498._0_4_ = memoryProperties.memoryTypeCount;
    local_498._4_4_ = memoryProperties.memoryTypes[0].propertyFlags;
    pDStack_490 = (DeviceInterface *)memoryProperties.memoryTypes._4_8_;
    memoryProperties.memoryTypeCount = 0;
    memoryProperties.memoryTypes[0].propertyFlags = 0;
    memoryProperties.memoryTypes[0].heapIndex = 0;
    memoryProperties.memoryTypes[1].propertyFlags = 0;
    auVar5 = (undefined1  [16])memoryProperties._0_16_;
    memoryProperties.memoryTypes[1].heapIndex = 0;
    memoryProperties.memoryTypes[2].propertyFlags = 0;
    memoryProperties.memoryTypes[2].heapIndex = 0;
    memoryProperties.memoryTypes[3].propertyFlags = 0;
    if (local_8f8.m_internal == 0) {
      DStack_8f0.m_device = (VkDevice)uVar29;
      DStack_8f0.m_allocator = (VkAllocationCallbacks *)uVar14;
      memoryProperties.memoryTypeCount = (deUint32)uVar12;
      memoryProperties.memoryTypes[0].propertyFlags = SUB84(uVar12,4);
      local_8f8.m_internal._0_4_ = memoryProperties.memoryTypeCount;
      local_8f8.m_internal._4_4_ = memoryProperties.memoryTypes[0].propertyFlags;
      DStack_8f0.m_deviceIface = (DeviceInterface *)uVar13;
    }
    else {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()(&DStack_8f0,local_8f8);
      local_8f8.m_internal = local_498;
      DStack_8f0.m_deviceIface = pDStack_490;
      DStack_8f0.m_device = local_488;
      DStack_8f0.m_allocator = pVStack_480;
      auVar5 = (undefined1  [16])memoryProperties._0_16_;
      if (memoryProperties._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)9>_> *)
                   &memoryProperties.memoryTypes[0].heapIndex,(VkImage)memoryProperties._0_8_);
        auVar5 = (undefined1  [16])memoryProperties._0_16_;
      }
    }
    memoryProperties._0_16_ = auVar5;
    bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&memoryProperties,vk,
              device,pAVar6,local_8f8,(MemoryRequirement)0x0);
    VVar7.m_data = local_9f8.m_data;
    uVar12 = memoryProperties._0_8_;
    if (local_928 == VK_FORMAT_UNDEFINED) {
      local_a20 = (long *)0x0;
    }
    else {
      local_220.format = caseDef->depthStencilFormat;
      local_220.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
      local_220.pNext = (void *)0x0;
      local_220.flags = 0;
      local_220.imageType = VK_IMAGE_TYPE_2D;
      local_220.extent.width = local_9f8.m_data[0];
      local_220.extent.height = local_9f8.m_data[1];
      local_220.extent.depth = 1;
      local_220.mipLevels = 1;
      local_220.arrayLayers = dVar38;
      local_220.samples = VK_SAMPLE_COUNT_1_BIT;
      local_220.tiling = VK_IMAGE_TILING_OPTIMAL;
      local_220.usage = 0x20;
      local_220.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
      local_220.queueFamilyIndexCount = 0;
      local_220.pQueueFamilyIndices = (deUint32 *)0x0;
      local_220.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
      local_9f8.m_data = VVar7.m_data;
      ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&memoryProperties,vk,device,
                        &local_220,(VkAllocationCallbacks *)0x0);
      uVar13 = memoryProperties._0_8_;
      uVar29 = memoryProperties.memoryTypes._4_8_;
      uVar14 = memoryProperties.memoryTypes._12_8_;
      uVar15 = memoryProperties.memoryTypes._20_8_;
      local_468 = (VkDevice)memoryProperties.memoryTypes._12_8_;
      pVStack_460 = (VkAllocationCallbacks *)memoryProperties.memoryTypes._20_8_;
      local_478._0_4_ = memoryProperties.memoryTypeCount;
      local_478._4_4_ = memoryProperties.memoryTypes[0].propertyFlags;
      pDStack_470 = (DeviceInterface *)memoryProperties.memoryTypes._4_8_;
      memoryProperties.memoryTypeCount = 0;
      memoryProperties.memoryTypes[0].propertyFlags = 0;
      memoryProperties.memoryTypes[0].heapIndex = 0;
      memoryProperties.memoryTypes[1].propertyFlags = 0;
      auVar5 = (undefined1  [16])memoryProperties._0_16_;
      memoryProperties.memoryTypes[1].heapIndex = 0;
      memoryProperties.memoryTypes[2].propertyFlags = 0;
      memoryProperties.memoryTypes[2].heapIndex = 0;
      memoryProperties.memoryTypes[3].propertyFlags = 0;
      if (local_898.m_internal == 0) {
        DStack_890.m_device = (VkDevice)uVar14;
        DStack_890.m_allocator = (VkAllocationCallbacks *)uVar15;
        memoryProperties.memoryTypeCount = (deUint32)uVar13;
        memoryProperties.memoryTypes[0].propertyFlags = SUB84(uVar13,4);
        local_898.m_internal._0_4_ = memoryProperties.memoryTypeCount;
        local_898.m_internal._4_4_ = memoryProperties.memoryTypes[0].propertyFlags;
        DStack_890.m_deviceIface = (DeviceInterface *)uVar29;
      }
      else {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()(&DStack_890,local_898)
        ;
        local_898.m_internal = local_478;
        DStack_890.m_deviceIface = pDStack_470;
        DStack_890.m_device = local_468;
        DStack_890.m_allocator = pVStack_460;
        auVar5 = (undefined1  [16])memoryProperties._0_16_;
        if (memoryProperties._0_8_ != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)9>_> *)
                     &memoryProperties.memoryTypes[0].heapIndex,(VkImage)memoryProperties._0_8_);
          auVar5 = (undefined1  [16])memoryProperties._0_16_;
        }
      }
      memoryProperties._0_16_ = auVar5;
      bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&memoryProperties,vk
                ,device,pAVar6,local_898,(MemoryRequirement)0x0);
      local_a20 = (long *)memoryProperties._0_8_;
    }
    genFullQuadVertices(&vertices,dVar38);
    VVar42 = (long)vertices.
                   super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)vertices.
                   super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    makeBufferCreateInfo(&bufferCreateInfo_1,VVar42,0x80);
    ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&memoryProperties,vk,device,
                       &bufferCreateInfo_1,(VkAllocationCallbacks *)0x0);
    uVar13 = memoryProperties._0_8_;
    uVar14 = memoryProperties.memoryTypes._4_8_;
    uVar15 = memoryProperties.memoryTypes._12_8_;
    uVar16 = memoryProperties.memoryTypes._20_8_;
    local_448 = (VkDevice)memoryProperties.memoryTypes._12_8_;
    pVStack_440 = (VkAllocationCallbacks *)memoryProperties.memoryTypes._20_8_;
    local_458._0_4_ = memoryProperties.memoryTypeCount;
    local_458._4_4_ = memoryProperties.memoryTypes[0].propertyFlags;
    pDStack_450 = (DeviceInterface *)memoryProperties.memoryTypes._4_8_;
    memoryProperties.memoryTypeCount = 0;
    memoryProperties.memoryTypes[0].propertyFlags = 0;
    uVar29 = memoryProperties._0_8_;
    memoryProperties.memoryTypes[0].heapIndex = 0;
    memoryProperties.memoryTypes[1].propertyFlags = 0;
    memoryProperties.memoryTypes[1].heapIndex = 0;
    memoryProperties.memoryTypes[2].propertyFlags = 0;
    memoryProperties.memoryTypes[2].heapIndex = 0;
    memoryProperties.memoryTypes[3].propertyFlags = 0;
    if (local_8b8.m_internal == 0) {
      DStack_8b0.m_device = (VkDevice)uVar15;
      DStack_8b0.m_allocator = (VkAllocationCallbacks *)uVar16;
      memoryProperties.memoryTypeCount = (deUint32)uVar13;
      memoryProperties.memoryTypes[0].propertyFlags = SUB84(uVar13,4);
      local_8b8.m_internal._0_4_ = memoryProperties.memoryTypeCount;
      local_8b8.m_internal._4_4_ = memoryProperties.memoryTypes[0].propertyFlags;
      DStack_8b0.m_deviceIface = (DeviceInterface *)uVar14;
      memoryProperties._0_8_ = uVar29;
    }
    else {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_8b0,local_8b8);
      local_8b8.m_internal = local_458;
      DStack_8b0.m_deviceIface = pDStack_450;
      DStack_8b0.m_device = local_448;
      DStack_8b0.m_allocator = pVStack_440;
      if (memoryProperties._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)8>_> *)
                   &memoryProperties.memoryTypes[0].heapIndex,(VkBuffer)memoryProperties._0_8_);
      }
    }
    bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&memoryProperties,vk,
               device,pAVar6,local_8b8,(MemoryRequirement)0x1);
    uVar13 = memoryProperties._0_8_;
    memcpy(*(void **)(memoryProperties._0_8_ + 0x18),
           vertices.
           super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
           ._M_impl.super__Vector_impl_data._M_start,VVar42);
    local_9e0 = (Allocator *)uVar13;
    ::vk::flushMappedMemoryRange
              (vk,device,(VkDeviceMemory)*(deUint64 *)(uVar13 + 8),*(VkDeviceSize *)(uVar13 + 0x10),
               VVar42);
    if (vertices.
        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vertices.
                      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)vertices.
                            super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vertices.
                            super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (caseDef->depthStencilFormat == VK_FORMAT_UNDEFINED) {
      bVar17 = false;
      uVar43 = 0;
    }
    else {
      TVar23 = ::vk::mapVkFormat(caseDef->depthStencilFormat);
      bVar17 = true;
      CVar19 = TVar23.order;
      if (CVar19 == DS) {
        uVar43 = 6;
      }
      else if (CVar19 == S) {
        uVar43 = 4;
      }
      else {
        if (CVar19 == D) {
          uVar43 = 2;
        }
        else {
          uVar43 = 1;
        }
        bVar17 = false;
      }
    }
    if (0 < (int)dVar38) {
      dVar39 = 0;
      basePipeline.m_internal = 0;
      do {
        VVar37 = VK_IMAGE_VIEW_TYPE_LAST;
        if ((ulong)caseDef->viewType < 7) {
          VVar37 = *(VkImageViewType *)(&DAT_00ae9928 + (ulong)caseDef->viewType * 4);
        }
        subresourceRange.levelCount = 1;
        subresourceRange.aspectMask = 1;
        subresourceRange.baseMipLevel = 0;
        subresourceRange.baseArrayLayer = dVar39;
        subresourceRange.layerCount = 1;
        makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)local_808,vk,device,local_8f8,VVar37,
                      caseDef->colorFormat,subresourceRange);
        pdVar26 = (deUint64 *)operator_new(0x20);
        pdVar26[2] = local_7f8._0_8_;
        pdVar26[3] = local_7f8._8_8_;
        *pdVar26 = (deUint64)local_808;
        pdVar26[1] = (deUint64)auStack_800;
        _local_808 = (undefined1  [16])0x0;
        local_7f8 = (undefined1  [16])0x0;
        memoryProperties.memoryTypes[0].heapIndex = 0;
        memoryProperties.memoryTypes[1].propertyFlags = 0;
        memoryProperties._0_8_ = pdVar26;
        puVar27 = (undefined8 *)operator_new(0x20);
        *(undefined4 *)(puVar27 + 1) = 0;
        *(undefined4 *)((long)puVar27 + 0xc) = 0;
        *puVar27 = &PTR__SharedPtrState_00d24850;
        puVar27[2] = pdVar26;
        *(undefined4 *)(puVar27 + 1) = 1;
        *(undefined4 *)((long)puVar27 + 0xc) = 1;
        memoryProperties.memoryTypes._4_8_ = puVar27;
        std::
        vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
        ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>
                  ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
                    *)&colorAttachments,
                   (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
                   &memoryProperties);
        if (memoryProperties.memoryTypes._4_8_ != 0) {
          LOCK();
          piVar1 = (int *)(memoryProperties.memoryTypes._4_8_ + 8);
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            memoryProperties.memoryTypeCount = 0;
            memoryProperties.memoryTypes[0].propertyFlags = 0;
            (**(code **)(*(long *)memoryProperties.memoryTypes._4_8_ + 0x10))();
          }
          LOCK();
          piVar1 = (int *)(memoryProperties.memoryTypes._4_8_ + 0xc);
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (memoryProperties.memoryTypes._4_8_ != 0) {
              (**(code **)(*(long *)memoryProperties.memoryTypes._4_8_ + 8))();
            }
            memoryProperties.memoryTypes[0].heapIndex = 0;
            memoryProperties.memoryTypes[1].propertyFlags = 0;
          }
        }
        if (local_808 != (undefined1  [8])0x0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)13>_> *)(local_808 + 8),
                     (VkImageView)local_808);
        }
        local_7f8 = (undefined1  [16])0x0;
        _local_808 = (undefined1  [16])0x0;
        if (attachmentHandles.
            super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            attachmentHandles.
            super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vk::Handle<(vk::HandleType)13>,std::allocator<vk::Handle<(vk::HandleType)13>>>
          ::_M_realloc_insert<vk::Handle<(vk::HandleType)13>const&>
                    ((vector<vk::Handle<(vk::HandleType)13>,std::allocator<vk::Handle<(vk::HandleType)13>>>
                      *)&attachmentHandles,
                     (iterator)
                     attachmentHandles.
                     super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (Handle<(vk::HandleType)13> *)
                     colorAttachments.
                     super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr);
        }
        else {
          (attachmentHandles.
           super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->m_internal =
               ((colorAttachments.
                 super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr)->
               super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
          attachmentHandles.
          super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               attachmentHandles.
               super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        makeGraphicsPipeline
                  ((Move<vk::Handle<(vk::HandleType)18>_> *)local_828,vk,device,basePipeline,
                   local_4b8,local_7e8,(VkShaderModule)bufferCreateInfo._0_8_,
                   (VkShaderModule)
                   local_568.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
                   (IVec2 *)(ulong)(uint)local_9f8.m_data[0],local_9f8.m_data[1],dVar39,
                   SUB41((uVar43 & 2) >> 1,0),bVar17);
        pdVar26 = (deUint64 *)operator_new(0x20);
        pdVar26[2] = local_818._0_8_;
        pdVar26[3] = local_818._8_8_;
        *pdVar26 = (deUint64)local_828;
        pdVar26[1] = (deUint64)auStack_820;
        _local_828 = (undefined1  [16])0x0;
        local_818 = (undefined1  [16])0x0;
        memoryProperties.memoryTypes[0].heapIndex = 0;
        memoryProperties.memoryTypes[1].propertyFlags = 0;
        memoryProperties._0_8_ = pdVar26;
        puVar27 = (undefined8 *)operator_new(0x20);
        *(undefined4 *)(puVar27 + 1) = 0;
        *(undefined4 *)((long)puVar27 + 0xc) = 0;
        *puVar27 = &PTR__SharedPtrState_00d24a90;
        puVar27[2] = pdVar26;
        *(undefined4 *)(puVar27 + 1) = 1;
        *(undefined4 *)((long)puVar27 + 0xc) = 1;
        memoryProperties.memoryTypes._4_8_ = puVar27;
        std::
        vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>>
        ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>
                  ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>>
                    *)&pipelines,
                   (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_> *)
                   &memoryProperties);
        if (memoryProperties.memoryTypes._4_8_ != 0) {
          LOCK();
          piVar1 = (int *)(memoryProperties.memoryTypes._4_8_ + 8);
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            memoryProperties.memoryTypeCount = 0;
            memoryProperties.memoryTypes[0].propertyFlags = 0;
            (**(code **)(*(long *)memoryProperties.memoryTypes._4_8_ + 0x10))();
          }
          LOCK();
          piVar1 = (int *)(memoryProperties.memoryTypes._4_8_ + 0xc);
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (memoryProperties.memoryTypes._4_8_ != 0) {
              (**(code **)(*(long *)memoryProperties.memoryTypes._4_8_ + 8))();
            }
            memoryProperties.memoryTypes[0].heapIndex = 0;
            memoryProperties.memoryTypes[1].propertyFlags = 0;
          }
        }
        if (local_828 != (undefined1  [8])0x0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)18>_> *)(local_828 + 8),
                     (VkPipeline)local_828);
        }
        dVar38 = local_868;
        local_818 = (undefined1  [16])0x0;
        _local_828 = (undefined1  [16])0x0;
        basePipeline.m_internal =
             ((pipelines.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->m_ptr->
             super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal;
        dVar39 = dVar39 + 1;
      } while (local_868 != dVar39);
      if (local_928 != VK_FORMAT_UNDEFINED) {
        dVar39 = 0;
        do {
          res_1.baseMipLevel = 0;
          res_1.levelCount = 1;
          res_1.layerCount = 1;
          subresourceRange_00.baseMipLevel = 0;
          subresourceRange_00.aspectMask = uVar43;
          subresourceRange_00.levelCount = 1;
          subresourceRange_00.baseArrayLayer = dVar39;
          subresourceRange_00.layerCount = 1;
          res_1.aspectMask = uVar43;
          res_1.baseArrayLayer = dVar39;
          makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)local_848,vk,device,local_898,
                        VK_IMAGE_VIEW_TYPE_2D,caseDef->depthStencilFormat,subresourceRange_00);
          pdVar26 = (deUint64 *)operator_new(0x20);
          pdVar26[2] = local_838._0_8_;
          pdVar26[3] = local_838._8_8_;
          *pdVar26 = (deUint64)local_848;
          pdVar26[1] = (deUint64)auStack_840;
          _local_848 = (undefined1  [16])0x0;
          local_838 = (undefined1  [16])0x0;
          memoryProperties.memoryTypes[0].heapIndex = 0;
          memoryProperties.memoryTypes[1].propertyFlags = 0;
          memoryProperties._0_8_ = pdVar26;
          puVar27 = (undefined8 *)operator_new(0x20);
          *(undefined4 *)(puVar27 + 1) = 0;
          *(undefined4 *)((long)puVar27 + 0xc) = 0;
          *puVar27 = &PTR__SharedPtrState_00d24850;
          puVar27[2] = pdVar26;
          *(undefined4 *)(puVar27 + 1) = 1;
          *(undefined4 *)((long)puVar27 + 0xc) = 1;
          memoryProperties.memoryTypes._4_8_ = puVar27;
          std::
          vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
          ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>
                    ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
                      *)&depthStencilAttachments,
                     (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
                     &memoryProperties);
          if (memoryProperties.memoryTypes._4_8_ != 0) {
            LOCK();
            piVar1 = (int *)(memoryProperties.memoryTypes._4_8_ + 8);
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              memoryProperties.memoryTypeCount = 0;
              memoryProperties.memoryTypes[0].propertyFlags = 0;
              (**(code **)(*(long *)memoryProperties.memoryTypes._4_8_ + 0x10))();
            }
            LOCK();
            piVar1 = (int *)(memoryProperties.memoryTypes._4_8_ + 0xc);
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              if (memoryProperties.memoryTypes._4_8_ != 0) {
                (**(code **)(*(long *)memoryProperties.memoryTypes._4_8_ + 8))();
              }
              memoryProperties.memoryTypes[0].heapIndex = 0;
              memoryProperties.memoryTypes[1].propertyFlags = 0;
            }
          }
          if (local_848 != (undefined1  [8])0x0) {
            ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                      ((Deleter<vk::Handle<(vk::HandleType)13>_> *)(local_848 + 8),
                       (VkImageView)local_848);
          }
          local_838 = (undefined1  [16])0x0;
          _local_848 = (undefined1  [16])0x0;
          if (attachmentHandles.
              super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              attachmentHandles.
              super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<vk::Handle<(vk::HandleType)13>,std::allocator<vk::Handle<(vk::HandleType)13>>>::
            _M_realloc_insert<vk::Handle<(vk::HandleType)13>const&>
                      ((vector<vk::Handle<(vk::HandleType)13>,std::allocator<vk::Handle<(vk::HandleType)13>>>
                        *)&attachmentHandles,
                       (iterator)
                       attachmentHandles.
                       super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (Handle<(vk::HandleType)13> *)
                       depthStencilAttachments.
                       super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr);
          }
          else {
            (attachmentHandles.
             super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->m_internal =
                 ((depthStencilAttachments.
                   super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr)->
                 super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
            attachmentHandles.
            super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 attachmentHandles.
                 super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          dVar39 = dVar39 + 1;
        } while (dVar38 != dVar39);
      }
    }
    makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&memoryProperties,vk,device,local_7e8,
                    (deUint32)
                    ((ulong)((long)attachmentHandles.
                                   super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)attachmentHandles.
                                  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3),
                    attachmentHandles.
                    super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,local_9f8.m_data[0],
                    local_9f8.m_data[1],1);
    uVar29 = memoryProperties.memoryTypes._4_8_;
    uVar13 = memoryProperties._0_8_;
    uVar14 = memoryProperties.memoryTypes._12_8_;
    uVar15 = memoryProperties.memoryTypes._20_8_;
    local_428 = (VkDevice)memoryProperties.memoryTypes._12_8_;
    pVStack_420 = (VkAllocationCallbacks *)memoryProperties.memoryTypes._20_8_;
    local_438._0_4_ = memoryProperties.memoryTypeCount;
    local_438._4_4_ = memoryProperties.memoryTypes[0].propertyFlags;
    pDStack_430 = (DeviceInterface *)memoryProperties.memoryTypes._4_8_;
    memoryProperties.memoryTypeCount = 0;
    memoryProperties.memoryTypes[0].propertyFlags = 0;
    memoryProperties.memoryTypes[0].heapIndex = 0;
    memoryProperties.memoryTypes[1].propertyFlags = 0;
    auVar5 = (undefined1  [16])memoryProperties._0_16_;
    memoryProperties.memoryTypes[1].heapIndex = 0;
    memoryProperties.memoryTypes[2].propertyFlags = 0;
    memoryProperties.memoryTypes[2].heapIndex = 0;
    memoryProperties.memoryTypes[3].propertyFlags = 0;
    if (local_8d8.m_internal == 0) {
      DStack_8d0.m_device = (VkDevice)uVar14;
      DStack_8d0.m_allocator = (VkAllocationCallbacks *)uVar15;
      memoryProperties.memoryTypeCount = (deUint32)uVar13;
      memoryProperties.memoryTypes[0].propertyFlags = SUB84(uVar13,4);
      local_8d8.m_internal._0_4_ = memoryProperties.memoryTypeCount;
      local_8d8.m_internal._4_4_ = memoryProperties.memoryTypes[0].propertyFlags;
      DStack_8d0.m_deviceIface = (DeviceInterface *)uVar29;
    }
    else {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_8d0,local_8d8);
      local_8d8.m_internal = local_438;
      DStack_8d0.m_deviceIface = pDStack_430;
      DStack_8d0.m_device = local_428;
      DStack_8d0.m_allocator = pVStack_420;
      auVar5 = (undefined1  [16])memoryProperties._0_16_;
      if (memoryProperties._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)23>_> *)
                   &memoryProperties.memoryTypes[0].heapIndex,(VkFramebuffer)memoryProperties._0_8_)
        ;
        auVar5 = (undefined1  [16])memoryProperties._0_16_;
      }
    }
    memoryProperties._0_16_ = auVar5;
    ::vk::createCommandPool
              ((Move<vk::Handle<(vk::HandleType)24>_> *)&memoryProperties,vk,device,2,local_8fc,
               (VkAllocationCallbacks *)0x0);
    auVar45 = (undefined1  [16])memoryProperties.memoryTypes._12_16_;
    auVar5 = (undefined1  [16])memoryProperties._0_16_;
    local_978.propertyFlags = memoryProperties.memoryTypes[1].heapIndex;
    local_978.heapIndex = memoryProperties.memoryTypes[2].propertyFlags;
    VStack_970 = auVar45._8_4_;
    dStack_96c = auVar45._12_4_;
    local_988._0_4_ = memoryProperties.memoryTypeCount;
    local_988._4_4_ = memoryProperties.memoryTypes[0].propertyFlags;
    local_988._8_4_ = memoryProperties.memoryTypes[0].heapIndex;
    local_988._12_4_ = memoryProperties.memoryTypes[1].propertyFlags;
    uVar13 = memoryProperties._0_8_;
    memoryProperties._0_16_ = auVar5;
    memoryProperties.memoryTypes._12_16_ = auVar45;
    makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&memoryProperties,vk,device,
                      (VkCommandPool)uVar13);
    auVar45 = (undefined1  [16])memoryProperties.memoryTypes._12_16_;
    auVar5 = (undefined1  [16])memoryProperties._0_16_;
    uVar13 = memoryProperties._0_8_;
    bufferCreateInfo_1.flags = memoryProperties.memoryTypes[1].heapIndex;
    bufferCreateInfo_1._20_4_ = memoryProperties.memoryTypes[2].propertyFlags;
    bufferCreateInfo_1.size._0_4_ = memoryProperties.memoryTypes[2].heapIndex;
    bufferCreateInfo_1.size._4_4_ = memoryProperties.memoryTypes[3].propertyFlags;
    bufferCreateInfo_1.sType = memoryProperties.memoryTypeCount;
    bufferCreateInfo_1._4_4_ = memoryProperties.memoryTypes[0].propertyFlags;
    bufferCreateInfo_1.pNext = (void *)memoryProperties.memoryTypes._4_8_;
    memoryProperties._0_16_ = auVar5;
    memoryProperties.memoryTypes._12_16_ = auVar45;
    beginCommandBuffer(vk,(VkCommandBuffer)uVar13);
    VVar4 = caseDef->colorFormat;
    bVar17 = ::vk::isUintFormat(VVar4);
    uVar29 = 0x7d0000007d;
    if (!bVar17) {
      bVar17 = ::vk::isIntFormat(VVar4);
      uVar29 = 0x3f8000003f800000;
      if (bVar17) {
        uVar29 = 0x7d0000007d;
      }
    }
    memoryProperties.memoryTypes[0].heapIndex = (int)uVar29;
    memoryProperties.memoryTypes[1].propertyFlags = (int)((ulong)uVar29 >> 0x20);
    memoryProperties.memoryTypeCount = (int)uVar29;
    memoryProperties.memoryTypes[0].propertyFlags = (int)((ulong)uVar29 >> 0x20);
    std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::vector
              ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)&vertices,
               (long)(int)dVar38,(value_type *)&memoryProperties,
               (allocator_type *)&vertexBufferOffset);
    if (local_928 != VK_FORMAT_UNDEFINED) {
      memoryProperties.memoryTypeCount = 0x3f800000;
      memoryProperties.memoryTypes[0].propertyFlags = 0x2a;
      std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::_M_fill_insert
                ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)&vertices,
                 (iterator)
                 vertices.
                 super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(long)(int)dVar38,
                 (value_type *)&memoryProperties);
    }
    VVar7.m_data = local_9f8.m_data;
    memoryProperties.memoryTypeCount = 0x2b;
    memoryProperties.memoryTypes[0].heapIndex = 0;
    memoryProperties.memoryTypes[1].propertyFlags = 0;
    memoryProperties.memoryTypes[2].heapIndex = (undefined4)local_8d8.m_internal;
    memoryProperties.memoryTypes[3].propertyFlags = local_8d8.m_internal._4_4_;
    memoryProperties.memoryTypes[1].heapIndex = (undefined4)local_7e8.m_internal;
    memoryProperties.memoryTypes[2].propertyFlags = local_7e8.m_internal._4_4_;
    memoryProperties.memoryTypes[3].heapIndex = 0;
    memoryProperties.memoryTypes[4].propertyFlags = 0;
    memoryProperties.memoryTypes[4].heapIndex = local_9f8.m_data[0];
    memoryProperties.memoryTypes[5].propertyFlags = local_9f8.m_data[1];
    memoryProperties.memoryTypes[5].heapIndex =
         (deUint32)
         ((ulong)((long)vertices.
                        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)vertices.
                       super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 4);
    memoryProperties.memoryTypes._52_8_ =
         vertices.
         super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
         ._M_impl.super__Vector_impl_data._M_start;
    vertexBufferOffset = 0;
    local_9f8.m_data = VVar7.m_data;
    (*vk->_vptr_DeviceInterface[0x74])(vk,uVar13,&memoryProperties,0);
    (*vk->_vptr_DeviceInterface[0x58])(vk,uVar13,0,1,&local_8b8,&vertexBufferOffset);
    if (vertices.
        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vertices.
                      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)vertices.
                            super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vertices.
                            super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (dVar38 != 0) {
      uVar34 = 0;
      do {
        if (uVar34 != 0) {
          (*vk->_vptr_DeviceInterface[0x75])(vk,uVar13,0);
        }
        (*vk->_vptr_DeviceInterface[0x4c])
                  (vk,uVar13,0,
                   **(undefined8 **)
                     ((long)&(pipelines.
                              super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_ptr + uVar34 * 4));
        (*vk->_vptr_DeviceInterface[0x59])(vk,uVar13,4,1,uVar34 & 0xffffffff,0);
        uVar34 = uVar34 + 4;
      } while ((ulong)dVar38 << 2 != uVar34);
    }
    (*vk->_vptr_DeviceInterface[0x76])(vk,uVar13);
    memoryProperties.memoryTypeCount = 0x2d;
    memoryProperties.memoryTypes[0].heapIndex = 0;
    memoryProperties.memoryTypes[1].propertyFlags = 0;
    memoryProperties.memoryTypes[2].heapIndex = 2;
    memoryProperties.memoryTypes[3].propertyFlags = 6;
    memoryProperties.memoryTypes[1].heapIndex = 0x100;
    memoryProperties.memoryTypes[2].propertyFlags = 0x800;
    memoryProperties.memoryTypes[3].heapIndex = 0xffffffff;
    memoryProperties.memoryTypes[4].propertyFlags = 0xffffffff;
    memoryProperties.memoryTypes[4].heapIndex = (undefined4)local_8f8.m_internal;
    memoryProperties.memoryTypes[5].propertyFlags = local_8f8.m_internal._4_4_;
    memoryProperties.memoryTypes[5].heapIndex = 1;
    memoryProperties.memoryTypes[6].propertyFlags = 0;
    memoryProperties.memoryTypes[6].heapIndex = 1;
    memoryProperties.memoryTypes[7].propertyFlags = 0;
    memoryProperties.memoryTypes[7].heapIndex = local_9f8.m_data[3];
    (*vk->_vptr_DeviceInterface[0x6d])(vk,uVar13,0x400,0x1000,0,0,0,0,0,1,(int)&memoryProperties);
    local_928 = (iStack_870 - local_548._8_4_) / 2;
    iStack_924 = (iStack_86c - local_548._12_4_) / 2;
    vertices.
    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vertices.
    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vertices.
    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_00000001;
    iStack_920 = local_928;
    iStack_91c = iStack_924;
    local_868 = iStack_924;
    iStack_864 = iStack_924;
    iStack_860 = iStack_924;
    iStack_85c = iStack_924;
    (*vk->_vptr_DeviceInterface[99])
              (vk,uVar13,local_8f8.m_internal,6,obj.m_internal,1,(int)&vertices);
    vertexBufferOffset = CONCAT44(vertexBufferOffset._4_4_,0x2c);
    local_1b0[0] = 0;
    local_1b0[1] = 0;
    local_1b0[2] = 0x1000;
    local_1b0[3] = 0x2000;
    local_1b0[4] = -1;
    local_1b0[5] = -1;
    local_198 = (void *)obj.m_internal;
    local_190 = 0;
    local_188 = 0xffffffffffffffff;
    (*vk->_vptr_DeviceInterface[0x6d])(vk,uVar13,0x1000,0x4000,0,0,0,1,(int)&vertexBufferOffset,0,0)
    ;
    result = (*vk->_vptr_DeviceInterface[0x4a])(vk,uVar13);
    ::vk::checkResult(result,"vk.endCommandBuffer(*cmdBuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineRenderToImageTests.cpp"
                      ,0x410);
    submitCommandsAndWait(vk,device,local_4c0,(VkCommandBuffer)uVar13);
    if (uVar13 != 0) {
      memoryProperties._0_16_ = CONCAT88(memoryProperties.memoryTypes._4_8_,uVar13);
      (**(code **)(*bufferCreateInfo_1.pNext + 0x240))
                (bufferCreateInfo_1.pNext,bufferCreateInfo_1._16_8_,bufferCreateInfo_1.size,1,
                 &memoryProperties);
    }
    if ((int  [2])local_988._0_8_ != (int  [2])0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)24>_> *)(local_988 + 8),
                 (VkCommandPool)local_988._0_8_);
    }
    ::vk::invalidateMappedMemoryRange
              (vk,device,(VkDeviceMemory)*(deUint64 *)(uVar8 + 8),*(VkDeviceSize *)(uVar8 + 0x10),
               0xffffffffffffffff);
    bufferCreateInfo_1._0_8_ = ::vk::mapVkFormat(caseDef->colorFormat);
    iVar18 = local_900;
    if (local_900 < local_904) {
      iVar18 = local_904;
    }
    VVar4 = local_868;
    if ((int)local_868 < (int)local_928) {
      VVar4 = local_928;
    }
    iVar33 = (int)local_9d0;
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&memoryProperties,(TextureFormat *)&bufferCreateInfo_1,
               iVar33,iVar30,iVar18,*(void **)(uVar8 + 0x18));
    tcu::TextureLevel::TextureLevel
              ((TextureLevel *)&vertices,(TextureFormat *)&bufferCreateInfo_1,iVar33,iVar30,iVar18);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&vertexBufferOffset,(TextureLevel *)&vertices)
    ;
    local_988._4_4_ = iVar30;
    local_988._0_4_ = (VkStructureType)local_9d0;
    generateExpectedImage((PixelBufferAccess *)&vertexBufferOffset,(IVec2 *)local_988,VVar4);
    bVar17 = ::vk::isFloatFormat(caseDef->colorFormat);
    psVar11 = local_910;
    paVar10 = local_918;
    log = context->m_testCtx->m_log;
    if (bVar17) {
      local_988._0_4_ = 0x3c23d70a;
      local_988._4_4_ = 0x3c23d70a;
      local_988._8_8_ = (void *)0x3c23d70a3c23d70a;
      bVar17 = tcu::floatThresholdCompare
                         (log,"Image Comparison","",(ConstPixelBufferAccess *)&vertexBufferOffset,
                          (ConstPixelBufferAccess *)&memoryProperties,(Vec4 *)local_988,
                          COMPARE_LOG_RESULT);
    }
    else {
      local_988._0_4_ = 2;
      local_988._4_4_ = 2;
      local_988._8_8_ = (void *)0x200000002;
      bVar17 = tcu::intThresholdCompare
                         (log,"Image Comparison","",(ConstPixelBufferAccess *)&vertexBufferOffset,
                          (ConstPixelBufferAccess *)&memoryProperties,(UVec4 *)local_988,
                          COMPARE_LOG_RESULT);
    }
    pAVar6 = local_9e0;
    local_988._0_8_ = &local_978;
    if (bVar17 == false) {
      local_988._8_8_ = (void *)0x4;
      local_978._0_5_ = 0x6c696146;
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar10;
      std::__cxx11::string::_M_construct<char*>(psVar11,&local_978,&local_978.heapIndex);
    }
    else {
      local_988._8_8_ = (void *)0x4;
      local_978._0_5_ = 0x73736150;
      __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar10;
      std::__cxx11::string::_M_construct<char*>(psVar11,&local_978,&local_978.heapIndex);
      pAVar6 = local_9e0;
    }
    if ((VkMemoryType *)local_988._0_8_ != &local_978) {
      operator_delete((void *)local_988._0_8_,(long)local_978 + 1);
    }
    tcu::TextureLevel::~TextureLevel((TextureLevel *)&vertices);
    if (local_8d8.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_8d0,local_8d8);
    }
    if (pAVar6 != (Allocator *)0x0) {
      (**(code **)(*(long *)pAVar6 + 8))(pAVar6);
    }
    if (local_8b8.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_8b0,local_8b8);
    }
    if (attachmentHandles.
        super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(attachmentHandles.
                      super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)attachmentHandles.
                            super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)attachmentHandles.
                            super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ::~vector(&depthStencilAttachments);
    if (local_a20 != (long *)0x0) {
      (**(code **)(*local_a20 + 8))(local_a20);
    }
    if (local_898.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()(&DStack_890,local_898);
    }
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ::~vector(&colorAttachments);
    if (uVar12 != 0) {
      (**(code **)(*(long *)uVar12 + 8))(uVar12);
    }
    if (local_8f8.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()(&DStack_8f0,local_8f8);
    }
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ::~vector(&pipelines);
    if (local_4b8.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_4b0,local_4b8);
    }
    if (local_7e8.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()(&DStack_7e0,local_7e8);
    }
    if (local_568.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)14>_> *)
                 &local_568.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
                 (VkShaderModule)
                 local_568.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
    }
    if (bufferCreateInfo._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)14>_> *)&bufferCreateInfo.pNext,
                 (VkShaderModule)bufferCreateInfo._0_8_);
    }
    if (uVar8 != 0) {
      (**(code **)(*(long *)uVar8 + 8))(uVar8);
    }
    if (obj.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                (&DStack_4e0,(VkBuffer)obj.m_internal);
    }
    return __return_storage_ptr__;
  }
  this = (OutOfMemoryError *)__cxa_allocate_exception(0x38);
  memoryProperties._0_8_ = &memoryProperties.memoryTypes[1].heapIndex;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&memoryProperties,"Image size exceeds test\'s image memory budget","");
  ::vk::OutOfMemoryError::OutOfMemoryError
            (this,VK_ERROR_OUT_OF_DEVICE_MEMORY,(string *)&memoryProperties);
  __cxa_throw(this,&::vk::OutOfMemoryError::typeinfo,::vk::OutOfMemoryError::~OutOfMemoryError);
}

Assistant:

tcu::TestStatus testAttachmentSize (Context& context, const CaseDef caseDef)
{
	checkImageViewTypeRequirements(context, caseDef.viewType);

	int sizeReductionIndex = 0;

	for (;;)
	{
		try
		{
			return testWithSizeReduction(context, caseDef, sizeReductionIndex);
		}
		catch (OutOfMemoryError& ex)
		{
			context.getTestContext().getLog()
				<< tcu::TestLog::Message << "-- OutOfMemoryError: " << ex.getMessage() << tcu::TestLog::EndMessage;

			++sizeReductionIndex;
		}
	}
	// Never reached
}